

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

SmallVectorImpl<llvm::DWARFDebugLoc::Entry> * __thiscall
llvm::SmallVectorImpl<llvm::DWARFDebugLoc::Entry>::operator=
          (SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *this,
          SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *RHS)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *__ptr;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint *puVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  
  if (this != RHS) {
    puVar8 = (uint *)(RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                     super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                     super_SmallVectorBase.BeginX;
    if ((SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *)puVar8 == RHS + 1) {
      uVar1 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
              super_SmallVectorBase.Size;
      uVar2 = (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
              super_SmallVectorBase.Size;
      uVar5 = (ulong)uVar2;
      if (uVar2 < uVar1) {
        if ((this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
            super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
            Capacity < uVar1) {
          if (uVar5 != 0) {
            pvVar4 = (void *)((long)(this->
                                    super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>
                                    ).
                                    super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>
                                    .super_SmallVectorBase.BeginX + uVar5 * 0x28 + -8);
            lVar7 = uVar5 * -0x28;
            do {
              if (pvVar4 != *(void **)((long)pvVar4 + -0x10)) {
                free(*(void **)((long)pvVar4 + -0x10));
              }
              pvVar4 = (void *)((long)pvVar4 + -0x28);
              lVar7 = lVar7 + 0x28;
            } while (lVar7 != 0);
          }
          (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
          super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
          Size = 0;
          SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::grow
                    (&this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>,
                     (ulong)uVar1);
          uVar5 = 0;
        }
        else if (uVar5 == 0) {
          uVar5 = 0;
        }
        else {
          pvVar4 = (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                   super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                   super_SmallVectorBase.BeginX;
          uVar6 = uVar5 + 1;
          lVar7 = 0;
          do {
            puVar9 = (undefined8 *)(lVar7 + (long)puVar8);
            uVar3 = puVar9[1];
            puVar10 = (undefined8 *)((long)pvVar4 + lVar7);
            *puVar10 = *puVar9;
            puVar10[1] = uVar3;
            SmallVectorImpl<unsigned_char>::operator=
                      ((SmallVectorImpl<unsigned_char> *)(puVar10 + 2),
                       (SmallVectorImpl<unsigned_char> *)(puVar9 + 2));
            uVar6 = uVar6 - 1;
            lVar7 = lVar7 + 0x28;
          } while (1 < uVar6);
        }
        pvVar4 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                 super_SmallVectorBase.BeginX;
        std::__uninitialized_copy<false>::
        __uninit_copy<std::move_iterator<llvm::DWARFDebugLoc::Entry*>,llvm::DWARFDebugLoc::Entry*>
                  ((Entry *)((long)pvVar4 + uVar5 * 0x28),
                   (Entry *)((long)pvVar4 +
                            (ulong)(RHS->
                                   super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>)
                                   .
                                   super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>
                                   .super_SmallVectorBase.Size * 0x28),
                   (Entry *)(uVar5 * 0x28 +
                            (long)(this->
                                  super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                                  super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                                  super_SmallVectorBase.BeginX));
        if ((this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
            super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
            Capacity < uVar1) {
LAB_00af5ecf:
          __assert_fail("N <= capacity()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                        ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
        }
        (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
        super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size
             = uVar1;
      }
      else {
        puVar9 = (undefined8 *)
                 (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                 super_SmallVectorBase.BeginX;
        puVar10 = puVar9;
        if (uVar1 != 0) {
          uVar5 = (ulong)uVar1 + 1;
          do {
            uVar3 = *(undefined8 *)(puVar8 + 2);
            *puVar9 = *(undefined8 *)puVar8;
            puVar9[1] = uVar3;
            SmallVectorImpl<unsigned_char>::operator=
                      ((SmallVectorImpl<unsigned_char> *)(puVar9 + 2),
                       (SmallVectorImpl<unsigned_char> *)(puVar8 + 4));
            puVar9 = puVar9 + 5;
            uVar5 = uVar5 - 1;
            puVar8 = puVar8 + 10;
          } while (1 < uVar5);
          uVar5 = (ulong)(this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                         super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                         super_SmallVectorBase.Size;
          puVar10 = (undefined8 *)
                    (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                    super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                    super_SmallVectorBase.BeginX;
        }
        if (puVar10 + uVar5 * 5 != puVar9) {
          puVar10 = puVar10 + uVar5 * 5 + -1;
          do {
            if (puVar10 != (undefined8 *)puVar10[-2]) {
              free((undefined8 *)puVar10[-2]);
            }
            puVar11 = puVar10 + -4;
            puVar10 = puVar10 + -5;
          } while (puVar11 != puVar9);
        }
        if ((this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
            super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
            Capacity < uVar1) goto LAB_00af5ecf;
        (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
        super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size
             = uVar1;
      }
      clear(RHS);
    }
    else {
      __ptr = (SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *)
              (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
              super_SmallVectorBase.BeginX;
      uVar5 = (ulong)(this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                     super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                     super_SmallVectorBase.Size;
      if (uVar5 != 0) {
        pvVar4 = (void *)((long)__ptr + uVar5 * 0x28 + -8);
        lVar7 = uVar5 * -0x28;
        do {
          if (pvVar4 != *(void **)((long)pvVar4 + -0x10)) {
            free(*(void **)((long)pvVar4 + -0x10));
          }
          pvVar4 = (void *)((long)pvVar4 + -0x28);
          lVar7 = lVar7 + 0x28;
        } while (lVar7 != 0);
        __ptr = (SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *)
                (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                super_SmallVectorBase.BeginX;
      }
      if (__ptr != this + 1) {
        free(__ptr);
      }
      (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.BeginX
           = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
             super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase
             .BeginX;
      uVar1 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
              super_SmallVectorBase.Capacity;
      (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size =
           (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
           super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
           Size;
      (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
      Capacity = uVar1;
      (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.BeginX
           = RHS + 1;
      (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size =
           0;
      (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
      Capacity = 0;
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->Size = RHS.Size;
    this->Capacity = RHS.Capacity;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->set_size(RHSSize);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);

  RHS.clear();
  return *this;
}